

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_at_Test::test_matrix_sparse_at_Test(test_matrix_sparse_at_Test *this)

{
  test_matrix_sparse_at_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__test_matrix_sparse_at_Test_001f5568;
  return;
}

Assistant:

TEST(test_matrix_sparse, at) {
  Matrix_Sparse matrix_non_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), 6.0);
  matrix_non_const.at(3, 4) = -10.0;
  EXPECT_DOUBLE_EQ(matrix_non_const.at(3, 4), -10.0);
  EXPECT_DEATH(double x = matrix_non_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_non_const.at(10, 2), "./*");

  const Matrix_Sparse matrix_const({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_DOUBLE_EQ(matrix_const.at(3, 4), 6.0);
  EXPECT_DEATH(double x = matrix_const.at(10, 4), "./*");
  EXPECT_DEATH(double x = matrix_const.at(0, 6), "./*");
  EXPECT_DEATH(double x = matrix_const.at(10, 2), "./*");
}